

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_interface_block(CompilerGLSL *this,SPIRVariable *var)

{
  ID *__k;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  pointer pcVar2;
  size_t sVar3;
  uint64_t uVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  SPIRType *type;
  mapped_type *pmVar8;
  undefined4 extraout_var;
  SPIREntryPoint *pSVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  iterator iVar11;
  SPIRType *pSVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  TypedID<(spirv_cross::Types)0> *in_R9;
  __hashtable *__h;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  __hashtable *__h_1;
  long lVar16;
  __node_gen_type __node_gen;
  char *block_qualifier;
  char *qual;
  SPIRType newtype;
  undefined1 local_220 [32];
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_200;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f8;
  TypedID<(spirv_cross::Types)1> *local_1f0;
  char *local_1e8 [2];
  char local_1d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  char *local_188;
  undefined1 local_180 [32];
  uint *local_160;
  size_t local_158;
  uint local_148 [8];
  bool *local_128;
  size_t local_120;
  bool local_110 [24];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  if ((((var->storage == Input) && (type->basetype == Double)) && ((this->options).es == false)) &&
     ((this->options).version < 0x19a)) {
    local_180._0_8_ = local_180 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"GL_ARB_vertex_attrib_64bit","");
    require_extension_internal(this,(string *)local_180);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_);
    }
  }
  local_200 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&(this->super_Compiler).ir.meta;
  __k = &(type->super_IVariant).self;
  pmVar8 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_200,__k);
  uVar4 = (pmVar8->decoration).decoration_flags.lower;
  iVar7 = (*(this->super_Compiler)._vptr_Compiler[0x33])(this,var);
  local_188 = (char *)CONCAT44(extraout_var,iVar7);
  if ((uVar4 & 4) == 0) {
    if (type->basetype != Struct) {
LAB_00317b47:
      local_180._0_4_ = (var->super_IVariant).self.id;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_200,(key_type *)local_180);
      add_variable(this,&this->resource_names,&this->block_names,(string *)pmVar8);
      SPIRType::SPIRType((SPIRType *)local_180,type);
      bVar6 = (this->options).es;
      uVar13 = (this->options).version;
      bVar5 = 1;
      if ((bVar6 & uVar13 < 300) == 0) {
        bVar5 = ~bVar6 & uVar13 < 0x82;
      }
      if (((bVar5 != 0) && (var->storage == Input)) && (type->basetype == Int)) {
        local_180._16_4_ = 0xd;
      }
      if ((((type->storage == Input) &&
           ((type->array).super_VectorView<unsigned_int>.buffer_size != 0)) &&
          (bVar6 = Compiler::has_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationPatch), !bVar6)) &&
         ((pSVar9 = Compiler::get_entry_point(&this->super_Compiler),
          pSVar9->model == ExecutionModelTessellationControl ||
          (pSVar9 = Compiler::get_entry_point(&this->super_Compiler),
          pSVar9->model == ExecutionModelTessellationEvaluation)))) {
        local_160[local_158 - 1] = 0;
        local_128[local_120 - 1] = true;
      }
      layout_for_variable_abi_cxx11_((string *)local_220,this,var);
      (*(this->super_Compiler)._vptr_Compiler[0x32])
                (&local_1a8,this,(ulong)(var->super_IVariant).self.id);
      (*(this->super_Compiler)._vptr_Compiler[6])
                (local_1e8,this,(ulong)(var->super_IVariant).self.id,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])
                (&local_1c8,this,local_180,local_1e8,(ulong)(var->super_IVariant).self.id);
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220
                 ,&local_1a8,&local_1c8,(char (*) [2])0x405f81);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)local_220._0_8_ !=
          (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)(local_220 + 0x10)) {
        operator_delete((void *)local_220._0_8_);
      }
      local_180._0_8_ = &PTR__SPIRType_004faf78;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      local_b8 = 0;
      if (local_c0 != local_a8) {
        free(local_c0);
      }
      local_f0 = 0;
      if (local_f8 != local_e0) {
        free(local_f8);
      }
      local_120 = 0;
      if (local_128 != local_110) {
        free(local_128);
      }
      local_158 = 0;
      if (local_160 == local_148) {
        return;
      }
      free(local_160);
      return;
    }
    if ((this->options).force_flattened_io_blocks == false) {
      uVar13 = 0x95;
      if ((this->options).es != false) {
        uVar13 = 0x135;
      }
      if (uVar13 < (this->options).version) goto LAB_00317b47;
    }
  }
  else if ((this->options).force_flattened_io_blocks == false) {
    bVar6 = (this->options).es;
    uVar13 = (this->options).version;
    uVar15 = 0x95;
    if (bVar6 != false) {
      uVar15 = 0x135;
    }
    if (uVar15 < uVar13) {
      if (uVar13 < 0x140 && bVar6 == true) {
        pcVar2 = local_180 + 0x10;
        local_180._0_8_ = pcVar2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,"GL_EXT_geometry_shader","");
        pbVar10 = (this->forced_extensions).
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .ptr;
        pbVar10 = ::std::
                  __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (pbVar10,pbVar10 + (this->forced_extensions).
                                               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               .buffer_size,local_180);
        if (pbVar10 ==
            (this->forced_extensions).
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr + (this->forced_extensions).
                   super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .buffer_size) {
          local_220._0_8_ =
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)(local_220 + 0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_220,"GL_EXT_tessellation_shader","");
          pbVar10 = (this->forced_extensions).
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr;
          pbVar10 = ::std::
                    __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              (pbVar10,pbVar10 + (this->forced_extensions).
                                                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 .buffer_size,local_220);
          bVar6 = pbVar10 ==
                  (this->forced_extensions).
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .ptr + (this->forced_extensions).
                         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .buffer_size;
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_220._0_8_ !=
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)(local_220 + 0x10)) {
            operator_delete((void *)local_220._0_8_);
          }
        }
        else {
          bVar6 = false;
        }
        if ((pointer)local_180._0_8_ != pcVar2) {
          operator_delete((void *)local_180._0_8_);
        }
        if (bVar6) {
          local_180._0_8_ = pcVar2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_180,"GL_EXT_shader_io_blocks","");
          require_extension_internal(this,(string *)local_180);
          if ((pointer)local_180._0_8_ != pcVar2) {
            operator_delete((void *)local_180._0_8_);
          }
        }
      }
      fixup_io_block_patch_primitive_qualifiers(this,var);
      (*(this->super_Compiler)._vptr_Compiler[6])
                (local_180,this,(ulong)(type->super_IVariant).self.id,0);
      this_00 = &(this->block_output_names)._M_h;
      if (type->storage == Input) {
        this_00 = &(this->block_input_names)._M_h;
      }
      if ((local_180._8_8_ == 0) ||
         (iVar11 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(this_00,(key_type *)local_180),
         iVar11.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0)) {
        (*(this->super_Compiler)._vptr_Compiler[3])(local_220,this,(ulong)__k->id);
        ::std::__cxx11::string::_M_assign((string *)local_180);
        if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)local_220._0_8_ !=
            (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_);
        }
      }
      else {
        local_220._0_8_ = this_00;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this_00,local_180);
      }
      if (local_180._8_8_ == 0) {
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(var->super_IVariant).field_0xc);
        join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                  ((string *)local_220,(spirv_cross *)0x3e75a6,
                   (char (*) [2])&(pSVar12->super_IVariant).self,
                   (TypedID<(spirv_cross::Types)0> *)0x3e75a6,
                   (char (*) [2])&(var->super_IVariant).self,in_R9);
        ::std::__cxx11::string::operator=((string *)local_180,(string *)local_220);
        if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)local_220._0_8_ !=
            (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_);
        }
      }
      puVar1 = &this->resource_names;
      local_220._0_8_ = puVar1;
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar1,local_180);
      bVar6 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationPatch);
      if (bVar6) {
        local_1e8[0] = "patch ";
      }
      else {
        bVar6 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                           DecorationPerPrimitiveEXT);
        if (bVar6) {
          local_1e8[0] = "perprimitiveEXT ";
        }
        else {
          local_1e8[0] = "";
        }
      }
      layout_for_variable_abi_cxx11_((string *)local_220,this,var);
      statement<std::__cxx11::string,char_const*&,char_const*&,std::__cxx11::string&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220
                 ,local_1e8,&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_);
      }
      statement<char_const(&)[2]>(this,(char (*) [2])0x3e8478);
      this->indent = this->indent + 1;
      local_1f8 = puVar1;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(type->member_name_cache)._M_h);
      sVar3 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar3 != 0) {
        local_1f0 = (type->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
        lVar16 = sVar3 << 2;
        uVar14 = 0;
        do {
          add_member_name(this,type,(uint32_t)uVar14);
          uVar13 = local_1f0[uVar14].id;
          local_220._0_8_ = local_220 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"");
          (*(this->super_Compiler)._vptr_Compiler[0x15])
                    (this,type,(ulong)uVar13,uVar14 & 0xffffffff,(string *)local_220,0);
          if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
            operator_delete((void *)local_220._0_8_);
          }
          uVar14 = uVar14 + 1;
          lVar16 = lVar16 + -4;
        } while (lVar16 != 0);
      }
      local_220._0_4_ = (var->super_IVariant).self.id;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_200,(key_type *)local_220);
      add_variable(this,local_1f8,&this->block_names,(string *)pmVar8);
      (*(this->super_Compiler)._vptr_Compiler[6])
                (&local_1a8,this,(ulong)(var->super_IVariant).self.id,1);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ulong)(var->super_IVariant).self.id;
      (*(this->super_Compiler)._vptr_Compiler[0x26])(&local_1c8,this,type);
      join<std::__cxx11::string,std::__cxx11::string>
                ((string *)local_220,(spirv_cross *)&local_1a8,&local_1c8,pbVar10);
      end_scope_decl(this,(string *)local_220);
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      statement<char_const(&)[1]>(this,(char (*) [1])0x3dee59);
      if ((undefined1 *)local_180._0_8_ == local_180 + 0x10) {
        return;
      }
      operator_delete((void *)local_180._0_8_);
      return;
    }
  }
  emit_flattened_io_block(this,var,local_188);
  return;
}

Assistant:

void CompilerGLSL::emit_interface_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	if (var.storage == StorageClassInput && type.basetype == SPIRType::Double &&
	    !options.es && options.version < 410)
	{
		require_extension_internal("GL_ARB_vertex_attrib_64bit");
	}

	// Either make it plain in/out or in/out blocks depending on what shader is doing ...
	bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);
	const char *qual = to_storage_qualifiers_glsl(var);

	if (block)
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		    (!options.es && options.version < 150))
		{
			// I/O blocks on ES require version 310 with Android Extension Pack extensions, or core version 320.
			// On desktop, I/O blocks were introduced with geometry shaders in GL 3.2 (GLSL 150).
			emit_flattened_io_block(var, qual);
		}
		else
		{
			if (options.es && options.version < 320)
			{
				// Geometry and tessellation extensions imply this extension.
				if (!has_extension("GL_EXT_geometry_shader") && !has_extension("GL_EXT_tessellation_shader"))
					require_extension_internal("GL_EXT_shader_io_blocks");
			}

			// Workaround to make sure we can emit "patch in/out" correctly.
			fixup_io_block_patch_primitive_qualifiers(var);

			// Block names should never alias.
			auto block_name = to_name(type.self, false);

			// The namespace for I/O blocks is separate from other variables in GLSL.
			auto &block_namespace = type.storage == StorageClassInput ? block_input_names : block_output_names;

			// Shaders never use the block by interface name, so we don't
			// have to track this other than updating name caches.
			if (block_name.empty() || block_namespace.find(block_name) != end(block_namespace))
				block_name = get_fallback_name(type.self);
			else
				block_namespace.insert(block_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (block_name.empty())
				block_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			// Instance names cannot alias block names.
			resource_names.insert(block_name);

			const char *block_qualifier;
			if (has_decoration(var.self, DecorationPatch))
				block_qualifier = "patch ";
			else if (has_decoration(var.self, DecorationPerPrimitiveEXT))
				block_qualifier = "perprimitiveEXT ";
			else
				block_qualifier = "";

			statement(layout_for_variable(var), block_qualifier, qual, block_name);
			begin_scope();

			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}

			add_resource_name(var.self);
			end_scope_decl(join(to_name(var.self), type_to_array_glsl(type, var.self)));
			statement("");
		}
	}
	else
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (type.basetype == SPIRType::Struct &&
		    (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		     (!options.es && options.version < 150)))
		{
			emit_flattened_io_block(var, qual);
		}
		else
		{
			add_resource_name(var.self);

			// Legacy GLSL did not support int attributes, we automatically
			// declare them as float and cast them on load/store
			SPIRType newtype = type;
			if (is_legacy() && var.storage == StorageClassInput && type.basetype == SPIRType::Int)
				newtype.basetype = SPIRType::Float;

			// Tessellation control and evaluation shaders must have either
			// gl_MaxPatchVertices or unsized arrays for input arrays.
			// Opt for unsized as it's the more "correct" variant to use.
			if (type.storage == StorageClassInput && !type.array.empty() &&
			    !has_decoration(var.self, DecorationPatch) &&
			    (get_entry_point().model == ExecutionModelTessellationControl ||
			     get_entry_point().model == ExecutionModelTessellationEvaluation))
			{
				newtype.array.back() = 0;
				newtype.array_size_literal.back() = true;
			}

			statement(layout_for_variable(var), to_qualifiers_glsl(var.self),
			          variable_decl(newtype, to_name(var.self), var.self), ";");
		}
	}
}